

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fixExprCb(Walker *p,Expr *pExpr)

{
  undefined8 *puVar1;
  char *in_RSI;
  long in_RDI;
  DbFixer *pFix;
  
  puVar1 = *(undefined8 **)(in_RDI + 0x28);
  if (*(char *)(puVar1 + 8) == '\0') {
    *(uint *)(in_RSI + 4) = *(uint *)(in_RSI + 4) | 0x40000000;
  }
  if (*in_RSI == -99) {
    if (*(char *)(*(long *)*puVar1 + 0xc5) == '\0') {
      sqlite3ErrorMsg((Parse *)*puVar1,"%s cannot use variables",puVar1[10]);
      return 2;
    }
    *in_RSI = 'z';
  }
  return 0;
}

Assistant:

static int fixExprCb(Walker *p, Expr *pExpr){
  DbFixer *pFix = p->u.pFix;
  if( !pFix->bTemp ) ExprSetProperty(pExpr, EP_FromDDL);
  if( pExpr->op==TK_VARIABLE ){
    if( pFix->pParse->db->init.busy ){
      pExpr->op = TK_NULL;
    }else{
      sqlite3ErrorMsg(pFix->pParse, "%s cannot use variables", pFix->zType);
      return WRC_Abort;
    }
  }
  return WRC_Continue;
}